

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateFunctionContextAccess
               (ExpressionTranslateContext *ctx,ExprFunctionContextAccess *expression)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  
  pTVar1 = expression->function->contextType;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    pTVar1 = (TypeBase *)0x0;
  }
  if (pTVar1 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x50d,
                  "void TranslateFunctionContextAccess(ExpressionTranslateContext &, ExprFunctionContextAccess *)"
                 );
  }
  pp_Var2 = pTVar1[1]._vptr_TypeBase;
  if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x18)) {
    pp_Var2 = (_func_int **)0x0;
  }
  if (pp_Var2 != (_func_int **)0x0) {
    if (pp_Var2[6] != (_func_int *)0x0) {
      TranslateVariableName(ctx,expression->contextVariable);
      return;
    }
    Print(ctx,"(");
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,")0");
    return;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                ,0x511,
                "void TranslateFunctionContextAccess(ExpressionTranslateContext &, ExprFunctionContextAccess *)"
               );
}

Assistant:

void TranslateFunctionContextAccess(ExpressionTranslateContext &ctx, ExprFunctionContextAccess *expression)
{
	TypeRef *refType = getType<TypeRef>(expression->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	if(classType->size == 0)
	{
		Print(ctx, "(");
		TranslateTypeName(ctx, expression->type);
		Print(ctx, ")0");
	}
	else
	{
		TranslateVariableName(ctx, expression->contextVariable);
	}
}